

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.c
# Opt level: O1

void TraceLog(int logType,char *text,...)

{
  char in_AL;
  size_t sVar1;
  size_t sVar2;
  undefined8 in_RCX;
  undefined8 in_RDX;
  size_t __n;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  va_list args;
  char buffer [256];
  __va_list_tag local_1f8;
  undefined8 local_1d8;
  undefined2 local_1d0;
  undefined1 local_d8 [16];
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined8 local_38;
  
  if (in_AL != '\0') {
    local_a8 = in_XMM0_Qa;
    local_98 = in_XMM1_Qa;
    local_88 = in_XMM2_Qa;
    local_78 = in_XMM3_Qa;
    local_68 = in_XMM4_Qa;
    local_58 = in_XMM5_Qa;
    local_48 = in_XMM6_Qa;
    local_38 = in_XMM7_Qa;
  }
  if (logTypeLevel <= logType) {
    local_1f8.reg_save_area = local_d8;
    local_1f8.overflow_arg_area = &args[0].overflow_arg_area;
    local_1f8.gp_offset = 0x10;
    local_1f8.fp_offset = 0x30;
    local_c8 = in_RDX;
    local_c0 = in_RCX;
    local_b8 = in_R8;
    local_b0 = in_R9;
    if (traceLog == (TraceLogCallback)0x0) {
      memset(&local_1d8,0,0x100);
      switch(logType) {
      case 1:
        local_1d8 = 0x203a4543415254;
        break;
      case 2:
        local_1d8 = 0x203a4755424544;
        break;
      case 3:
        local_1d8 = CONCAT17(local_1d8._7_1_,0x203a4f000000);
        local_1d8 = CONCAT44(local_1d8._4_4_,0x4f464e49);
        break;
      case 4:
        local_1d8 = 0x3a474e494e524157;
        local_1d0 = 0x20;
        break;
      case 5:
        local_1d8 = 0x203a524f525245;
        break;
      case 6:
        local_1d8 = 0x203a4c41544146;
      }
      sVar1 = strlen(text);
      sVar2 = strlen((char *)&local_1d8);
      __n = 0xf4;
      if ((uint)sVar1 < 0xf4) {
        __n = sVar1 & 0xffffffff;
      }
      memcpy((void *)((long)&local_1d8 + sVar2),text,__n);
      sVar1 = strlen((char *)&local_1d8);
      *(undefined2 *)((long)&local_1d8 + sVar1) = 10;
      vprintf((char *)&local_1d8,&local_1f8);
      fflush(_stdout);
      if (logType == 6) {
        exit(1);
      }
    }
    else {
      (*traceLog)(logType,text,&local_1f8);
    }
  }
  return;
}

Assistant:

void TraceLog(int logType, const char *text, ...)
{
#if defined(SUPPORT_TRACELOG)
    // Message has level below current threshold, don't emit
    if (logType < logTypeLevel) return;

    va_list args;
    va_start(args, text);

    if (traceLog)
    {
        traceLog(logType, text, args);
        va_end(args);
        return;
    }

#if defined(PLATFORM_ANDROID)
    switch (logType)
    {
        case LOG_TRACE: __android_log_vprint(ANDROID_LOG_VERBOSE, "raylib", text, args); break;
        case LOG_DEBUG: __android_log_vprint(ANDROID_LOG_DEBUG, "raylib", text, args); break;
        case LOG_INFO: __android_log_vprint(ANDROID_LOG_INFO, "raylib", text, args); break;
        case LOG_WARNING: __android_log_vprint(ANDROID_LOG_WARN, "raylib", text, args); break;
        case LOG_ERROR: __android_log_vprint(ANDROID_LOG_ERROR, "raylib", text, args); break;
        case LOG_FATAL: __android_log_vprint(ANDROID_LOG_FATAL, "raylib", text, args); break;
        default: break;
    }
#else
    char buffer[MAX_TRACELOG_MSG_LENGTH] = { 0 };

    switch (logType)
    {
        case LOG_TRACE: strcpy(buffer, "TRACE: "); break;
        case LOG_DEBUG: strcpy(buffer, "DEBUG: "); break;
        case LOG_INFO: strcpy(buffer, "INFO: "); break;
        case LOG_WARNING: strcpy(buffer, "WARNING: "); break;
        case LOG_ERROR: strcpy(buffer, "ERROR: "); break;
        case LOG_FATAL: strcpy(buffer, "FATAL: "); break;
        default: break;
    }

    unsigned int textSize = (unsigned int)strlen(text);
    memcpy(buffer + strlen(buffer), text, (textSize < (MAX_TRACELOG_MSG_LENGTH - 12))? textSize : (MAX_TRACELOG_MSG_LENGTH - 12));
    strcat(buffer, "\n");
    vprintf(buffer, args);
    fflush(stdout);
#endif

    va_end(args);

    if (logType == LOG_FATAL) exit(EXIT_FAILURE);  // If fatal logging, exit program

#endif  // SUPPORT_TRACELOG
}